

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O0

int contextSend(mpt_reply_context_defer *ctx,mpt_reply_data *rd,mpt_message *msg)

{
  uint64_t local_38;
  uint64_t id;
  mpt_message *pmStack_28;
  int ret;
  mpt_message *msg_local;
  mpt_reply_data *rd_local;
  mpt_reply_context_defer *ctx_local;
  
  local_38 = 0;
  pmStack_28 = msg;
  msg_local = (mpt_message *)rd;
  rd_local = (mpt_reply_data *)ctx;
  if (rd->len == 0) {
    mpt_log((mpt_logger *)0x0,"contextSend",4,"%s: %s","bad reply operation","reply already sent");
    ctx_local._4_4_ = -1;
  }
  else if ((ctx->reply).send == (_func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *)0x0) {
    rd->len = 0;
    ctx_local._4_4_ = 0;
  }
  else {
    mpt_message_buf2id(rd->val,(ulong)rd->len,&local_38);
    if (rd_local[1] == (mpt_reply_data)0x0) {
      mpt_log((mpt_logger *)0x0,"contextSend",4,"%s %s","unable to reply",local_38,
              "no reply target available");
      ctx_local._4_4_ = 0;
    }
    else {
      *(byte *)((long)&msg_local->used + 4) = *(byte *)((long)&msg_local->used + 4) | 0x80;
      id._4_4_ = (*(code *)*rd_local)(rd_local[1],msg_local,pmStack_28);
      if (id._4_4_ < 0) {
        *(byte *)((long)&msg_local->used + 4) = *(byte *)((long)&msg_local->used + 4) & 0x7f;
        mpt_log((mpt_logger *)0x0,"contextSend",3,"%s %s","unable to reply",local_38,
                "reply send failed");
      }
      else {
        *(undefined2 *)((long)&msg_local->used + 2) = 0;
      }
      ctx_local._4_4_ = id._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int contextSend(const MPT_STRUCT(reply_context_defer) *ctx, MPT_STRUCT(reply_data) *rd, const MPT_STRUCT(message) *msg)
{
	int ret;
	uint64_t id = 0;
	
	if (!rd->len) {
		mpt_log(0, __func__, MPT_LOG(Warning), "%s: %s",
		        MPT_tr("bad reply operation"), MPT_tr("reply already sent"));
		return MPT_ERROR(BadArgument);
	}
	if (!ctx->reply.send) {
		rd->len = 0;
		return 0;
	}
	mpt_message_buf2id(rd->val, rd->len, &id);
	
	if (!ctx->reply.ptr) {
		mpt_log(0, __func__, MPT_LOG(Warning), "%s %s",
		        MPT_tr("unable to reply"), id, MPT_tr("no reply target available"));
		return 0;
	}
	rd->val[0] |= 0x80;
	ret = ctx->reply.send(ctx->reply.ptr, rd, msg);
	if (ret >= 0) {
		rd->len = 0;
	} else {
		rd->val[0] &= 0x7f;
		mpt_log(0, __func__, MPT_LOG(Error), "%s %s",
		        MPT_tr("unable to reply"), id, MPT_tr("reply send failed"));
	}
	return ret;
}